

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# visit.cpp
# Opt level: O0

value_type *
(anonymous_namespace)::
serialize_and_visit<(anonymous_namespace)::ToString,std::vector<int,std::allocator<int>>>
          (vector<int,_std::allocator<int>_> *in)

{
  value_type *in_RDI;
  string_view tag_00;
  cx_string<2UL> tag;
  InputStream istream;
  ToString visitor;
  OutputStream ostream;
  stringstream stream;
  ToString *in_stack_fffffffffffffc78;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffc80;
  undefined4 in_stack_fffffffffffffc90;
  undefined4 in_stack_fffffffffffffc94;
  value_type *visitor_00;
  long local_198 [51];
  
  visitor_00 = in_RDI;
  std::__cxx11::stringstream::stringstream((stringstream *)local_198);
  std::ios::exceptions((int)local_198 + (int)*(undefined8 *)(local_198[0] + -0x18));
  mserialize::serialize<std::vector<int,std::allocator<int>>,OutputStream>
            (in_stack_fffffffffffffc80,(OutputStream *)in_stack_fffffffffffffc78);
  anon_unknown.dwarf_ae198::ToString::ToString
            ((ToString *)CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90));
  mserialize::tag<std::vector<int,std::allocator<int>>>();
  tag_00 = mserialize::cx_string::operator_cast_to_string_view((cx_string<2UL> *)0x1a5529);
  mserialize::visit<(anonymous_namespace)::ToString,InputStream>
            (tag_00,(ToString *)visitor_00,(InputStream *)in_RDI);
  ToString::value_abi_cxx11_(in_stack_fffffffffffffc78);
  anon_unknown.dwarf_ae198::ToString::~ToString((ToString *)0x1a557f);
  std::__cxx11::stringstream::~stringstream((stringstream *)local_198);
  return visitor_00;
}

Assistant:

typename Visitor::value_type
serialize_and_visit(const T& in)
{
  std::stringstream stream;
  stream.exceptions(std::ios_base::failbit);

  // serialize
  OutputStream ostream{stream};
  mserialize::serialize(in, ostream);

  // visit
  Visitor visitor;
  InputStream istream{stream};
  const auto tag = mserialize::tag<T>();
  mserialize::visit(tag, visitor, istream);

  return visitor.value();
}